

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O0

void __thiscall Linker::FixupCallMicrocode(Linker *this,uint microcode,uint oldGlobalSize)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  ExternModuleInfo *pEVar4;
  uint *offset_1;
  uint *offset;
  uint oldGlobalSize_local;
  uint microcode_local;
  Linker *this_local;
  
  uVar1 = microcode;
  while (offset._4_4_ = uVar1,
        puVar2 = FastVector<unsigned_int,_false,_false>::operator[]
                           (&this->exRegVmConstants,offset._4_4_), *puVar2 != 1) {
    puVar2 = FastVector<unsigned_int,_false,_false>::operator[]
                       (&this->exRegVmConstants,offset._4_4_);
    uVar1 = offset._4_4_ + 1;
    switch(*puVar2) {
    case 2:
      uVar1 = offset._4_4_ + 2;
      break;
    case 3:
      uVar1 = offset._4_4_ + 2;
      break;
    case 4:
      uVar1 = offset._4_4_ + 2;
      break;
    case 5:
      uVar1 = offset._4_4_ + 2;
      break;
    case 6:
      puVar2 = FastVector<unsigned_int,_false,_false>::operator[]
                         (&this->exRegVmConstants,offset._4_4_ + 1);
      if (*puVar2 == 0) {
        puVar2 = FastVector<unsigned_int,_false,_false>::operator[]
                           (&this->exRegVmConstants,offset._4_4_ + 2);
        if (*puVar2 >> 0x18 == 0) {
          *puVar2 = oldGlobalSize + *puVar2;
        }
        else {
          uVar1 = *puVar2;
          puVar3 = FastVector<unsigned_int,_false,_false>::operator[]
                             (&this->moduleRemap,(*puVar2 >> 0x18) - 1);
          pEVar4 = FastVector<ExternModuleInfo,_false,_false>::operator[](&this->exModules,*puVar3);
          *puVar2 = (uVar1 & 0xffffff) + pEVar4->variableOffset;
        }
      }
      uVar1 = offset._4_4_ + 4;
    }
  }
  uVar1 = offset._4_4_ + 3;
  while (offset._4_4_ = uVar1,
        puVar2 = FastVector<unsigned_int,_false,_false>::operator[]
                           (&this->exRegVmConstants,offset._4_4_), *puVar2 != 7) {
    puVar2 = FastVector<unsigned_int,_false,_false>::operator[]
                       (&this->exRegVmConstants,offset._4_4_);
    if (*puVar2 - 8 < 2) {
      uVar1 = offset._4_4_ + 2;
    }
    else {
      uVar1 = offset._4_4_ + 1;
      if (*puVar2 == 10) {
        puVar2 = FastVector<unsigned_int,_false,_false>::operator[]
                           (&this->exRegVmConstants,offset._4_4_ + 1);
        if (*puVar2 == 0) {
          puVar2 = FastVector<unsigned_int,_false,_false>::operator[]
                             (&this->exRegVmConstants,offset._4_4_ + 2);
          if (*puVar2 >> 0x18 == 0) {
            *puVar2 = oldGlobalSize + *puVar2;
          }
          else {
            uVar1 = *puVar2;
            puVar3 = FastVector<unsigned_int,_false,_false>::operator[]
                               (&this->moduleRemap,(*puVar2 >> 0x18) - 1);
            pEVar4 = FastVector<ExternModuleInfo,_false,_false>::operator[]
                               (&this->exModules,*puVar3);
            *puVar2 = (uVar1 & 0xffffff) + pEVar4->variableOffset;
          }
        }
        uVar1 = offset._4_4_ + 4;
      }
    }
  }
  return;
}

Assistant:

void Linker::FixupCallMicrocode(unsigned microcode, unsigned oldGlobalSize)
{
	while(exRegVmConstants[microcode] != rvmiCall)
	{
		switch(exRegVmConstants[microcode++])
		{
		case rvmiPush:
			microcode++;
			break;
		case rvmiPushQword:
			microcode++;
			break;
		case rvmiPushImm:
			microcode++;
			break;
		case rvmiPushImmq:
			microcode++;
			break;
		case rvmiPushMem:
			if(exRegVmConstants[microcode] == rvrrGlobals)
			{
				unsigned &offset = exRegVmConstants[microcode + 1];

				if(offset >> 24)
					offset = (offset & 0x00ffffff) + exModules[moduleRemap[(offset >> 24) - 1]].variableOffset;
				else
					offset += oldGlobalSize;
			}

			microcode += 3;
			break;
		}
	}

	microcode += 3;

	while(exRegVmConstants[microcode] != rvmiReturn)
	{
		switch(exRegVmConstants[microcode++])
		{
		case rvmiPop:
		case rvmiPopq:
			microcode++;
			break;
		case rvmiPopMem:
			if(exRegVmConstants[microcode] == rvrrGlobals)
			{
				unsigned &offset = exRegVmConstants[microcode + 1];

				if(offset >> 24)
					offset = (offset & 0x00ffffff) + exModules[moduleRemap[(offset >> 24) - 1]].variableOffset;
				else
					offset += oldGlobalSize;
			}

			microcode += 3;
			break;
		}
	}
}